

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

void ga_distribution_(Integer *g_a,Integer *proc,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi
                     )

{
  Integer hi [2];
  Integer lo [2];
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  pnga_distribution(*g_a,*proc,&local_48,&local_58);
  *ilo = local_48;
  *jlo = local_40;
  *ihi = local_58;
  *jhi = local_50;
  return;
}

Assistant:

void FATR ga_distribution_(Integer *g_a, Integer *proc, Integer *ilo,
                           Integer *ihi, Integer *jlo, Integer *jhi)
{
  Integer lo[2], hi[2];
  wnga_distribution(*g_a, *proc, lo, hi);
  *ilo = lo[0];
  *jlo = lo[1];
  *ihi = hi[0];
  *jhi = hi[1];
}